

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_utl.cc
# Opt level: O0

int asn1_enc_save(ASN1_VALUE **pval,uchar *in,int inlen,ASN1_ITEM *it)

{
  bool bVar1;
  ASN1_ENCODING *enc_00;
  uint8_t *puVar2;
  size_t sVar3;
  undefined4 in_register_00000014;
  size_t size;
  CRYPTO_BUFFER *in_R8;
  ASN1_ENCODING *enc;
  CRYPTO_BUFFER *buf_local;
  ASN1_ITEM *it_local;
  size_t in_len_local;
  uint8_t *in_local;
  ASN1_VALUE **pval_local;
  
  size = CONCAT44(in_register_00000014,inlen);
  enc_00 = asn1_get_enc_ptr((ASN1_VALUE **)pval,(ASN1_ITEM *)it);
  if (enc_00 != (ASN1_ENCODING *)0x0) {
    asn1_encoding_clear(enc_00);
    if (in_R8 == (CRYPTO_BUFFER *)0x0) {
      puVar2 = (uint8_t *)OPENSSL_memdup(in,size);
      enc_00->enc = puVar2;
      if (enc_00->enc == (uint8_t *)0x0) {
        return 0;
      }
    }
    else {
      puVar2 = CRYPTO_BUFFER_data(in_R8);
      bVar1 = false;
      if (puVar2 <= in) {
        puVar2 = CRYPTO_BUFFER_data(in_R8);
        sVar3 = CRYPTO_BUFFER_len(in_R8);
        bVar1 = in + size <= puVar2 + sVar3;
      }
      if (!bVar1) {
        __assert_fail("CRYPTO_BUFFER_data(buf) <= in && in + in_len <= CRYPTO_BUFFER_data(buf) + CRYPTO_BUFFER_len(buf)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_utl.cc"
                      ,0x78,
                      "int asn1_enc_save(ASN1_VALUE **, const uint8_t *, size_t, const ASN1_ITEM *, CRYPTO_BUFFER *)"
                     );
      }
      CRYPTO_BUFFER_up_ref(in_R8);
      enc_00->buf = in_R8;
      enc_00->enc = in;
    }
    enc_00->len = size;
  }
  return 1;
}

Assistant:

int asn1_enc_save(ASN1_VALUE **pval, const uint8_t *in, size_t in_len,
                  const ASN1_ITEM *it, CRYPTO_BUFFER *buf) {
  ASN1_ENCODING *enc;
  enc = asn1_get_enc_ptr(pval, it);
  if (!enc) {
    return 1;
  }

  asn1_encoding_clear(enc);
  if (buf != NULL) {
    assert(CRYPTO_BUFFER_data(buf) <= in &&
           in + in_len <= CRYPTO_BUFFER_data(buf) + CRYPTO_BUFFER_len(buf));
    CRYPTO_BUFFER_up_ref(buf);
    enc->buf = buf;
    enc->enc = (uint8_t *)in;
  } else {
    enc->enc = reinterpret_cast<uint8_t *>(OPENSSL_memdup(in, in_len));
    if (!enc->enc) {
      return 0;
    }
  }

  enc->len = in_len;
  return 1;
}